

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

void bn_correct_top(BIGNUM *a)

{
  int iVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  
  iVar1 = a->top;
  uVar2 = (ulong)iVar1;
  if (0 < (long)uVar2) {
    puVar3 = a->d + uVar2;
    do {
      iVar1 = (int)uVar2;
      puVar3 = puVar3 + -1;
      if (*puVar3 != 0) goto LAB_00112726;
      uVar2 = (ulong)(iVar1 - 1);
    } while (1 < iVar1);
    iVar1 = 0;
LAB_00112726:
    a->top = iVar1;
  }
  if (iVar1 != 0) {
    return;
  }
  a->neg = 0;
  return;
}

Assistant:

void bn_correct_top(BIGNUM *a)
{
    BN_ULONG *ftl;
    int tmp_top = a->top;

    if (tmp_top > 0) {
        for (ftl = &(a->d[tmp_top]); tmp_top > 0; tmp_top--) {
            ftl--;
            if (*ftl != 0)
                break;
        }
        a->top = tmp_top;
    }
    if (a->top == 0)
        a->neg = 0;
    bn_pollute(a);
}